

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_length_value(char **begin,char *end,length_t *length,_Bool negative)

{
  _Bool _Var1;
  char local_3a;
  char local_39;
  length_t *plStack_38;
  char units [2];
  char *it;
  float value;
  _Bool negative_local;
  length_t *length_local;
  char *end_local;
  char **begin_local;
  
  it._0_4_ = 0.0;
  plStack_38 = (length_t *)*begin;
  it._7_1_ = negative;
  _value = length;
  length_local = (length_t *)end;
  end_local = (char *)begin;
  _Var1 = parse_float((char **)&stack0xffffffffffffffc8,end,(float *)&it);
  if (_Var1) {
    if (((it._7_1_ & 1) != 0) || (0.0 <= it._0_4_)) {
      memset(&local_3a,0,2);
      if (plStack_38 < length_local) {
        local_3a = *(char *)&plStack_38->value;
      }
      if ((length_t *)((long)&plStack_38->value + 1U) < length_local) {
        local_39 = *(char *)((long)&plStack_38->value + 1);
      }
      if (local_3a == '%') {
        _value->value = it._0_4_;
        _value->type = length_type_percent;
        plStack_38 = (length_t *)((long)&plStack_38->value + 1);
      }
      else if (local_3a == 'c') {
        if (local_39 != 'm') {
          return false;
        }
        _value->value = (it._0_4_ * 96.0) / 2.54;
        _value->type = length_type_fixed;
        plStack_38 = (length_t *)((long)&plStack_38->value + 2);
      }
      else if (local_3a == 'i') {
        if (local_39 != 'n') {
          return false;
        }
        _value->value = it._0_4_ * 96.0;
        _value->type = length_type_fixed;
        plStack_38 = (length_t *)((long)&plStack_38->value + 2);
      }
      else if (local_3a == 'm') {
        if (local_39 != 'm') {
          return false;
        }
        _value->value = (it._0_4_ * 96.0) / 25.4;
        _value->type = length_type_fixed;
        plStack_38 = (length_t *)((long)&plStack_38->value + 2);
      }
      else if (local_3a == 'p') {
        if (local_39 == 'x') {
          _value->value = it._0_4_;
        }
        else if (local_39 == 'c') {
          _value->value = (it._0_4_ * 96.0) / 6.0;
        }
        else {
          if (local_39 != 't') {
            return false;
          }
          _value->value = (it._0_4_ * 96.0) / 72.0;
        }
        _value->type = length_type_fixed;
        plStack_38 = (length_t *)((long)&plStack_38->value + 2);
      }
      else {
        _value->value = it._0_4_;
        _value->type = length_type_fixed;
      }
      *(length_t **)end_local = plStack_38;
      begin_local._7_1_ = true;
    }
    else {
      begin_local._7_1_ = false;
    }
  }
  else {
    begin_local._7_1_ = false;
  }
  return begin_local._7_1_;
}

Assistant:

static bool parse_length_value(const char** begin, const char* end, length_t* length, bool negative)
{
    float value = 0;
    const char* it = *begin;
    if(!parse_float(&it, end, &value))
        return false;
    if(!negative && value < 0.f) {
        return false;
    }

    char units[2] = {0, 0};
    if(it + 0 < end)
        units[0] = it[0];
    if(it + 1 < end) {
        units[1] = it[1];
    }

    static const float dpi = 96.f;
    switch(units[0]) {
    case '%':
        length->value = value;
        length->type = length_type_percent;
        it += 1;
        break;
    case 'p':
        if(units[1] == 'x')
            length->value = value;
        else if(units[1] == 'c')
            length->value = value * dpi / 6.f;
        else if(units[1] == 't')
            length->value = value * dpi / 72.f;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    case 'i':
        if(units[1] == 'n')
            length->value = value * dpi;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    case 'c':
        if(units[1] == 'm')
            length->value = value * dpi / 2.54f;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    case 'm':
        if(units[1] == 'm')
            length->value = value * dpi / 25.4f;
        else
            return false;
        length->type = length_type_fixed;
        it += 2;
        break;
    default:
        length->value = value;
        length->type = length_type_fixed;
        break;
    }

    *begin = it;
    return true;
}